

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
Omega_h::get_dim_class_ids
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Int class_dim,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_30;
  size_t i;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs_local;
  Int class_dim_local;
  vector<int,_std::allocator<int>_> *dim_class_ids;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (local_30 = 0;
      sVar1 = std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::size
                        (class_pairs), local_30 < sVar1; local_30 = local_30 + 1) {
    pvVar2 = std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator[]
                       (class_pairs,local_30);
    if (pvVar2->dim == class_dim) {
      pvVar2 = std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator[]
                         (class_pairs,local_30);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&pvVar2->id);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<LO> get_dim_class_ids(
    Int class_dim, std::vector<ClassPair> const& class_pairs) {
  std::vector<LO> dim_class_ids;
  for (size_t i = 0; i < class_pairs.size(); ++i) {
    if (class_pairs[i].dim == class_dim) {
      dim_class_ids.push_back(class_pairs[i].id);
    }
  }
  return dim_class_ids;
}